

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O2

Vec_Int_t * Gia_RsbCiWindow(Gia_Man_t *p,int nPis)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *vMap;
  Vec_Wec_t *p_01;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  
  p_00 = Vec_IntAlloc(100);
  vMap = Vec_IntStartFull(p->nObjs);
  iVar1 = Gia_ManLevelNum(p);
  p_01 = Vec_WecStart(iVar1 + 1);
  Gia_ManStaticFanoutStart(p);
  Gia_ManIncrementTravId(p);
  uVar2 = Gia_WinAddCiWithMaxFanouts(p);
  Gia_ObjSetTravIdCurrentId(p,uVar2);
  uVar4 = (ulong)uVar2;
  Vec_IntPush(p_00,uVar2);
  for (iVar1 = 1; iVar1 < nPis; iVar1 = iVar1 + 1) {
    uVar2 = Gia_WinAddCiWithMaxDivisors(p,p_01);
    uVar4 = (ulong)uVar2;
    Gia_WinTryAddingNode(p,uVar2,-1,p_01,p_00);
  }
  Vec_IntSort(p_00,(int)uVar4);
  pVVar3 = Gia_RsbCiTranslate(p,p_00,vMap);
  Gia_ManStaticFanoutStop(p);
  Vec_WecFree(p_01);
  Vec_IntFree(vMap);
  Vec_IntFree(p_00);
  return pVVar3;
}

Assistant:

Vec_Int_t * Gia_RsbCiWindow( Gia_Man_t * p, int nPis )
{
    Vec_Int_t * vRes;  int i, iMaxFan;
    Vec_Int_t * vNodes  = Vec_IntAlloc( 100 );
    Vec_Int_t * vMap    = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Wec_t * vLevels = Vec_WecStart( Gia_ManLevelNum(p)+1 );
    Gia_ManStaticFanoutStart( p );
    Gia_ManIncrementTravId(p);
    // add the first one
    iMaxFan = Gia_WinAddCiWithMaxFanouts( p );
    Gia_ObjSetTravIdCurrentId( p, iMaxFan );
    Vec_IntPush( vNodes, iMaxFan );
    // add remaining ones
    for ( i = 1; i < nPis; i++ )
    {
        iMaxFan = Gia_WinAddCiWithMaxDivisors( p, vLevels );
        Gia_WinTryAddingNode( p, iMaxFan, -1, vLevels, vNodes );
    }
    Vec_IntSort( vNodes, 0 );
    vRes = Gia_RsbCiTranslate( p, vNodes, vMap );
    Gia_ManStaticFanoutStop( p );
    Vec_WecFree( vLevels );
    Vec_IntFree( vMap );
//Vec_IntPrint( vNodes );
    Vec_IntFree( vNodes );
    return vRes;
}